

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

shared_ptr<cppcms::rpc::json_call> __thiscall
cppcms::rpc::json_rpc_server::release_call(json_rpc_server *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  element_type *in_RDI;
  shared_ptr<cppcms::rpc::json_call> sVar1;
  json_rpc_server *unaff_retaddr;
  shared_ptr<cppcms::rpc::json_call> *call;
  element_type *this_01;
  
  this_01 = in_RDI;
  check_call(unaff_retaddr);
  this_00 = std::
            __shared_ptr_access<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x44d147);
  application::release_context((application *)this_01);
  json_call::attach_context(this_00,&in_RDI->context_);
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x44d174)
  ;
  std::shared_ptr<cppcms::rpc::json_call>::shared_ptr
            ((shared_ptr<cppcms::rpc::json_call> *)this_00,
             (shared_ptr<cppcms::rpc::json_call> *)in_RDI);
  std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppcms::rpc::json_call>)
         sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<json_call> json_rpc_server::release_call()
	{
		check_call();
		current_call_->attach_context(release_context());
		booster::shared_ptr<json_call> call = current_call_;
		current_call_.reset();
		return call;
	}